

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

bool __thiscall CMessageHeader::IsCommandValid(CMessageHeader *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  char *p1;
  char *local_20;
  bool local_9;
  
  local_20 = (char *)(in_RDI + 4);
  do {
    if ((char *)(in_RDI + 0x10) <= local_20) {
      local_9 = true;
LAB_00e16a64:
      if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
        __stack_chk_fail();
      }
      return local_9;
    }
    if (*local_20 == '\0') {
      for (; local_20 < (char *)(in_RDI + 0x10); local_20 = local_20 + 1) {
        if (*local_20 != '\0') {
          local_9 = false;
          goto LAB_00e16a64;
        }
      }
    }
    else if ((*local_20 < ' ') || ('~' < *local_20)) {
      local_9 = false;
      goto LAB_00e16a64;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool CMessageHeader::IsCommandValid() const
{
    // Check the command string for errors
    for (const char* p1 = pchCommand; p1 < pchCommand + COMMAND_SIZE; ++p1) {
        if (*p1 == 0) {
            // Must be all zeros after the first zero
            for (; p1 < pchCommand + COMMAND_SIZE; ++p1) {
                if (*p1 != 0) {
                    return false;
                }
            }
        } else if (*p1 < ' ' || *p1 > 0x7E) {
            return false;
        }
    }

    return true;
}